

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_properties.hpp
# Opt level: O3

int __thiscall boost::unit_test::test_results::result_code(test_results *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  bVar1 = (this->p_skipped).super_readonly_property<bool>.super_class_property<bool>.value;
  uVar2 = (this->p_assertions_failed).super_readonly_property<unsigned_long>.
          super_class_property<unsigned_long>.value;
  uVar3 = (this->p_expected_failures).super_readonly_property<unsigned_long>.
          super_class_property<unsigned_long>.value;
  if ((((bVar1 == false) &&
       ((this->p_test_cases_failed).super_readonly_property<unsigned_long>.
        super_class_property<unsigned_long>.value == 0)) && (uVar2 <= uVar3)) &&
     (((this->p_test_cases_skipped).super_readonly_property<unsigned_long>.
       super_class_property<unsigned_long>.value == 0 &&
      (((this->p_aborted).super_readonly_property<bool>.super_class_property<bool>.value & 1U) == 0)
      ))) {
    return 0;
  }
  return (byte)(uVar3 < uVar2 | bVar1) | 200;
}

Assistant:

bool            operator!() const       { return !value; }